

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,PerspectiveCamera *this,
          CameraSample *sample,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Tuple2<pbrt::Point2,_float> TVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  float fVar17;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar18;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  RayDifferential local_108;
  undefined1 local_a8 [16];
  anon_struct_8_0_00000001_for___align local_90;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  undefined8 uStack_7c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  float fStack_58;
  float local_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  fVar19 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
  fVar18 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
  auVar50._4_4_ = fVar18;
  auVar50._0_4_ = fVar18;
  auVar50._8_4_ = fVar18;
  auVar50._12_4_ = fVar18;
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 1),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1]),
                          0x10);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[3][1])),auVar50,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0])
                           );
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[2][1])),auVar50,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0])
                           );
  auVar21._0_4_ = fVar19 * auVar30._0_4_;
  auVar21._4_4_ = fVar19 * auVar30._4_4_;
  auVar21._8_4_ = fVar19 * auVar30._8_4_;
  auVar21._12_4_ = fVar19 * auVar30._12_4_;
  auVar30 = vinsertps_avx((undefined1  [16])(this->super_ProjectiveCamera).cameraFromRaster.m.m[0],
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]),
                          0x10);
  auVar20 = vfmadd231ss_fma(auVar23,ZEXT816(0) << 0x40,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2])
                           );
  auVar23 = ZEXT816(0) << 0x20;
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT816(0) << 0x40,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2])
                           );
  fVar19 = auVar20._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  fVar18 = auVar22._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar22 = vfmadd213ps_fma(auVar30,auVar50,auVar21);
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 2),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]),
                          0x10);
  bVar12 = fVar19 == 1.0;
  auVar22 = vfmadd213ps_fma(auVar30,auVar23,auVar22);
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 3),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3]),
                          0x10);
  uVar16 = 0xff;
  if (!bVar12) {
    uVar16 = 0;
  }
  if (NAN(fVar19)) {
    uVar16 = 0;
  }
  local_108.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar29._0_4_ = auVar30._0_4_ + auVar22._0_4_;
  auVar29._4_4_ = auVar30._4_4_ + auVar22._4_4_;
  auVar29._8_4_ = auVar30._8_4_ + auVar22._8_4_;
  auVar29._12_4_ = auVar30._12_4_ + auVar22._12_4_;
  auVar22._4_4_ = fVar19;
  auVar22._0_4_ = fVar19;
  auVar22._8_4_ = fVar19;
  auVar22._12_4_ = fVar19;
  auVar30 = vdivps_avx(auVar29,auVar22);
  bVar11 = (bool)((byte)uVar16 & 1);
  auVar20._0_4_ = (float)((uint)bVar11 * (int)auVar29._0_4_ | (uint)!bVar11 * auVar30._0_4_);
  bVar11 = (bool)((byte)(uVar16 >> 1) & 1);
  auVar20._4_4_ = (float)((uint)bVar11 * (int)auVar29._4_4_ | (uint)!bVar11 * auVar30._4_4_);
  bVar11 = (bool)((byte)(uVar16 >> 2) & 1);
  auVar20._8_4_ = (float)((uint)bVar11 * (int)auVar29._8_4_ | (uint)!bVar11 * auVar30._8_4_);
  bVar11 = (bool)((byte)(uVar16 >> 3) & 1);
  auVar20._12_4_ = (float)((uint)bVar11 * (int)auVar29._12_4_ | (uint)!bVar11 * auVar30._12_4_);
  auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  fVar17 = (float)((uint)bVar12 * (int)fVar18 + (uint)!bVar12 * (int)(fVar18 / fVar19));
  auVar30 = vmovshdup_avx(auVar30);
  auVar30 = vfmadd231ss_fma(auVar30,auVar20,auVar20);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  auVar30 = vsqrtss_avx(auVar30,auVar30);
  fVar41 = auVar30._0_4_;
  auVar36._4_4_ = fVar41;
  auVar36._0_4_ = fVar41;
  auVar36._8_4_ = fVar41;
  auVar36._12_4_ = fVar41;
  fVar41 = fVar17 / fVar41;
  auVar30 = vdivps_avx(auVar20,auVar36);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(sample->time *
                                          (this->super_ProjectiveCamera).super_CameraBase.
                                          shutterClose)),ZEXT416((uint)(1.0 - sample->time)),
                            ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.
                                          shutterOpen));
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar30);
  local_108.super_Ray.time = auVar22._0_4_;
  local_108.hasDifferentials = false;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB328(ZEXT832(0),4);
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar19 = (this->super_ProjectiveCamera).lensRadius;
  fVar18 = fVar19;
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
  if (0.0 < fVar19) {
    TVar5 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
    fVar24 = TVar5.x;
    fVar25 = TVar5.y;
    auVar31._0_4_ = fVar24 + fVar24;
    auVar31._4_4_ = fVar25 + fVar25;
    auVar31._8_8_ = 0;
    auVar13._8_4_ = 0xbf800000;
    auVar13._0_8_ = 0xbf800000bf800000;
    auVar13._12_4_ = 0xbf800000;
    auVar21 = vaddps_avx512vl(auVar31,auVar13);
    fVar24 = auVar21._0_4_;
    auVar22 = vmovshdup_avx(auVar21);
    fVar25 = auVar22._0_4_;
    if ((((fVar24 != 0.0) || (NAN(fVar24))) || (fVar25 != 0.0)) || (NAN(fVar25))) {
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl(auVar21,auVar23);
      auVar23 = vshufps_avx(auVar22,auVar22,0xf5);
      auVar32._0_4_ = fVar24 / fVar25;
      auVar32._4_12_ = auVar21._4_12_;
      bVar12 = auVar23._0_4_ < auVar22._0_4_;
      auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar32,ZEXT416(0x3fc90fdb));
      local_a8._4_12_ = auVar23._4_12_;
      local_a8._0_4_ =
           (uint)bVar12 * (int)((fVar25 / fVar24) * 0.7853982) + (uint)!bVar12 * auVar23._0_4_;
      fVar18 = (float)((uint)bVar12 * (int)fVar24 + (uint)!bVar12 * (int)fVar25);
      fVar24 = cosf((float)local_a8._0_4_);
      fVar25 = sinf((float)local_a8._0_4_);
      auVar23 = vinsertps_avx(ZEXT416((uint)(fVar18 * fVar24)),ZEXT416((uint)(fVar18 * fVar25)),0x10
                             );
      fVar18 = (this->super_ProjectiveCamera).lensRadius;
    }
    fVar24 = (this->super_ProjectiveCamera).focalDistance / fVar41;
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar41 * fVar24 + 0.0;
    auVar26._0_4_ = fVar19 * auVar23._0_4_;
    auVar26._4_4_ = fVar19 * auVar23._4_4_;
    auVar26._8_4_ = fVar19 * auVar23._8_4_;
    auVar26._12_4_ = fVar19 * auVar23._12_4_;
    auVar37._0_4_ = fVar24 * auVar30._0_4_ + 0.0;
    auVar37._4_4_ = fVar24 * auVar30._4_4_ + 0.0;
    auVar37._8_4_ = fVar24 * auVar30._8_4_ + 0.0;
    auVar37._12_4_ = fVar24 * auVar30._12_4_ + 0.0;
    local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar26);
    auVar23 = vsubps_avx(auVar37,auVar26);
    auVar38._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar38._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar38._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar38._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar30 = vmovshdup_avx(auVar38);
    auVar30 = vfmadd231ss_fma(auVar30,auVar23,auVar23);
    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_108.super_Ray.d.
                                                    super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                            .z));
    auVar30 = vsqrtss_avx(auVar30,auVar30);
    fVar19 = auVar30._0_4_;
    auVar45._4_4_ = fVar19;
    auVar45._0_4_ = fVar19;
    auVar45._8_4_ = fVar19;
    auVar45._12_4_ = fVar19;
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
         local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar19;
    auVar30 = vdivps_avx(auVar23,auVar45);
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar30);
  }
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  if (fVar18 <= 0.0) {
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    uVar3 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar9 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar17 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar34._0_4_ = auVar20._0_4_ + (float)uVar3;
    auVar34._4_4_ = auVar20._4_4_ + (float)uVar9;
    auVar34._8_4_ = auVar20._8_4_ + 0.0;
    auVar34._12_4_ = auVar20._12_4_ + 0.0;
    auVar39._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar39._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar39._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar39._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar30 = vmovshdup_avx(auVar39);
    auVar30 = vfmadd231ss_fma(auVar30,auVar34,auVar34);
    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_108.rxDirection.
                                                    super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>
                                            .z));
    auVar30 = vsqrtss_avx(auVar30,auVar30);
    fVar19 = auVar30._0_4_;
    auVar43._4_4_ = fVar19;
    auVar43._0_4_ = fVar19;
    auVar43._8_4_ = fVar19;
    auVar43._12_4_ = fVar19;
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z / fVar19;
    auVar30 = vdivps_avx(auVar34,auVar43);
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar30);
    uVar4 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar10 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar35._0_4_ = auVar20._0_4_ + (float)uVar4;
    auVar35._4_4_ = auVar20._4_4_ + (float)uVar10;
    auVar35._8_4_ = auVar20._8_4_ + 0.0;
    auVar35._12_4_ = auVar20._12_4_ + 0.0;
    local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar17 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    goto LAB_0038fef2;
  }
  TVar5 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
  fVar19 = TVar5.x;
  fVar41 = TVar5.y;
  auVar27._0_4_ = fVar19 + fVar19;
  auVar27._4_4_ = fVar41 + fVar41;
  auVar27._8_8_ = 0;
  auVar14._8_4_ = 0xbf800000;
  auVar14._0_8_ = 0xbf800000bf800000;
  auVar14._12_4_ = 0xbf800000;
  auVar23 = vaddps_avx512vl(auVar27,auVar14);
  fVar41 = auVar23._0_4_;
  auVar30 = vmovshdup_avx(auVar23);
  fVar19 = auVar30._0_4_;
  if (fVar41 == 0.0) {
    auVar30 = ZEXT816(0) << 0x40;
    if ((fVar19 != 0.0) || (NAN(fVar19))) goto LAB_0038fcb7;
  }
  else {
LAB_0038fcb7:
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar22 = vandps_avx512vl(auVar23,auVar15);
    auVar51._0_4_ = fVar41 / fVar19;
    auVar51._4_12_ = auVar23._4_12_;
    auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar51,ZEXT416(0x3fc90fdb));
    auVar30 = vshufps_avx(auVar22,auVar22,0xf5);
    bVar12 = auVar30._0_4_ < auVar22._0_4_;
    fVar24 = (float)((uint)bVar12 * (int)((fVar19 / fVar41) * 0.7853982) +
                    (uint)!bVar12 * auVar23._0_4_);
    fVar19 = (float)((uint)bVar12 * (int)fVar41 + (uint)!bVar12 * (int)fVar19);
    fVar41 = cosf(fVar24);
    fVar24 = sinf(fVar24);
    auVar30 = vinsertps_avx(ZEXT416((uint)(fVar19 * fVar41)),ZEXT416((uint)(fVar19 * fVar24)),0x10);
  }
  fVar41 = fVar17 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar19 = (this->super_ProjectiveCamera).focalDistance;
  fVar17 = fVar17 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar33._0_4_ = fVar18 * auVar30._0_4_;
  auVar33._4_4_ = fVar18 * auVar30._4_4_;
  auVar33._8_4_ = fVar18 * auVar30._8_4_;
  auVar33._12_4_ = fVar18 * auVar30._12_4_;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar33);
  uVar1 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar7 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar46._0_4_ = auVar20._0_4_ + (float)uVar1;
  auVar46._4_4_ = auVar20._4_4_ + (float)uVar7;
  auVar46._8_4_ = auVar20._8_4_ + 0.0;
  auVar46._12_4_ = auVar20._12_4_ + 0.0;
  auVar49._0_4_ = auVar46._0_4_ * auVar46._0_4_;
  auVar49._4_4_ = auVar46._4_4_ * auVar46._4_4_;
  auVar49._8_4_ = auVar46._8_4_ * auVar46._8_4_;
  auVar49._12_4_ = auVar46._12_4_ * auVar46._12_4_;
  auVar30 = vmovshdup_avx(auVar49);
  auVar30 = vfmadd231ss_fma(auVar30,auVar46,auVar46);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
  auVar30 = vsqrtss_avx(auVar30,auVar30);
  fVar18 = auVar30._0_4_;
  auVar52._4_4_ = fVar18;
  auVar52._0_4_ = fVar18;
  auVar52._8_4_ = fVar18;
  auVar52._12_4_ = fVar18;
  auVar30 = vdivps_avx(auVar46,auVar52);
  fVar24 = fVar19 / (fVar41 / fVar18);
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = (fVar41 / fVar18) * fVar24 + 0.0;
  auVar47._0_4_ = auVar30._0_4_ * fVar24 + 0.0;
  auVar47._4_4_ = auVar30._4_4_ * fVar24 + 0.0;
  auVar47._8_4_ = auVar30._8_4_ * fVar24 + 0.0;
  auVar47._12_4_ = auVar30._12_4_ * fVar24 + 0.0;
  auVar23 = vsubps_avx(auVar47,auVar33);
  auVar53._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar53._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar53._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar53._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar30 = vmovshdup_avx(auVar53);
  auVar30 = vfmadd231ss_fma(auVar30,auVar23,auVar23);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_108.rxDirection.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z
                                   ));
  auVar30 = vsqrtss_avx(auVar30,auVar30);
  fVar18 = auVar30._0_4_;
  auVar55._4_4_ = fVar18;
  auVar55._0_4_ = fVar18;
  auVar55._8_4_ = fVar18;
  auVar55._12_4_ = fVar18;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z / fVar18;
  auVar30 = vdivps_avx(auVar23,auVar55);
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar30);
  uVar2 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar8 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar6 = vmovlps_avx(auVar33);
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar6;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar6 >> 0x20);
  auVar28._0_4_ = auVar20._0_4_ + (float)uVar2;
  auVar28._4_4_ = auVar20._4_4_ + (float)uVar8;
  auVar28._8_4_ = auVar20._8_4_ + 0.0;
  auVar28._12_4_ = auVar20._12_4_ + 0.0;
  auVar48._0_4_ = auVar28._0_4_ * auVar28._0_4_;
  auVar48._4_4_ = auVar28._4_4_ * auVar28._4_4_;
  auVar48._8_4_ = auVar28._8_4_ * auVar28._8_4_;
  auVar48._12_4_ = auVar28._12_4_ * auVar28._12_4_;
  auVar30 = vmovshdup_avx(auVar48);
  auVar30 = vfmadd231ss_fma(auVar30,auVar28,auVar28);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  auVar30 = vsqrtss_avx(auVar30,auVar30);
  fVar18 = auVar30._0_4_;
  auVar54._4_4_ = fVar18;
  auVar54._0_4_ = fVar18;
  auVar54._8_4_ = fVar18;
  auVar54._12_4_ = fVar18;
  auVar30 = vdivps_avx(auVar28,auVar54);
  fVar19 = fVar19 / (fVar17 / fVar18);
  auVar42._0_4_ = auVar30._0_4_ * fVar19 + 0.0;
  auVar42._4_4_ = auVar30._4_4_ * fVar19 + 0.0;
  auVar42._8_4_ = auVar30._8_4_ * fVar19 + 0.0;
  auVar42._12_4_ = auVar30._12_4_ * fVar19 + 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = (fVar17 / fVar18) * fVar19 + 0.0;
  auVar35 = vsubps_avx(auVar42,auVar33);
LAB_0038fef2:
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  auVar40._0_4_ = auVar35._0_4_ * auVar35._0_4_;
  auVar40._4_4_ = auVar35._4_4_ * auVar35._4_4_;
  auVar40._8_4_ = auVar35._8_4_ * auVar35._8_4_;
  auVar40._12_4_ = auVar35._12_4_ * auVar35._12_4_;
  auVar30 = vmovshdup_avx(auVar40);
  auVar30 = vfmadd231ss_fma(auVar30,auVar35,auVar35);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_108.ryDirection.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z
                                   ));
  auVar30 = vsqrtss_avx(auVar30,auVar30);
  fVar19 = auVar30._0_4_;
  auVar44._4_4_ = fVar19;
  auVar44._0_4_ = fVar19;
  auVar44._8_4_ = fVar19;
  auVar44._12_4_ = fVar19;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z / fVar19;
  auVar30 = vdivps_avx(auVar35,auVar44);
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar30);
  local_108.hasDifferentials = true;
  AnimatedTransform::operator()
            ((RayDifferential *)&local_90,(AnimatedTransform *)this,&local_108,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_90;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_84,fStack_88);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_80,fStack_84);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_7c;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_70.bits;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x3c) = CONCAT44(fStack_50,local_54);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x44) = CONCAT44(fStack_48,fStack_4c);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = uStack_44;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x54) = uStack_3c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uStack_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uStack_60;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) = CONCAT44(local_54,fStack_58);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x40) = CONCAT44(fStack_4c,fStack_50);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    const CameraSample &sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for \use{PerspectiveCamera} ray differentials
    if (lensRadius > 0) {
        // Compute \use{PerspectiveCamera} ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}